

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctxt,xmlChar *URL,xmlChar *ID,xmlNodePtr *listOut)

{
  xmlParserInputPtr input_00;
  xmlNodePtr cur;
  xmlNodePtr list;
  xmlParserInputPtr input;
  xmlNodePtr *listOut_local;
  xmlChar *ID_local;
  xmlChar *URL_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (listOut != (xmlNodePtr *)0x0) {
    *listOut = (xmlNodePtr)0x0;
  }
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0x73;
  }
  else {
    input_00 = xmlLoadResource(ctxt,(char *)URL,(char *)ID,XML_RESOURCE_GENERAL_ENTITY);
    if (input_00 == (xmlParserInputPtr)0x0) {
      ctxt_local._4_4_ = ctxt->errNo;
    }
    else {
      xmlCtxtInitializeLate(ctxt);
      cur = xmlCtxtParseContentInternal(ctxt,input_00,1,1);
      if (listOut == (xmlNodePtr *)0x0) {
        xmlFreeNodeList(cur);
      }
      else {
        *listOut = cur;
      }
      xmlFreeInputStream(input_00);
      ctxt_local._4_4_ = ctxt->errNo;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctxt, const xmlChar *URL,
                           const xmlChar *ID, xmlNodePtr *listOut) {
    xmlParserInputPtr input;
    xmlNodePtr list;

    if (listOut != NULL)
        *listOut = NULL;

    if (ctxt == NULL)
        return(XML_ERR_ARGUMENT);

    input = xmlLoadResource(ctxt, (char *) URL, (char *) ID,
                            XML_RESOURCE_GENERAL_ENTITY);
    if (input == NULL)
        return(ctxt->errNo);

    xmlCtxtInitializeLate(ctxt);

    list = xmlCtxtParseContentInternal(ctxt, input, /* hasTextDecl */ 1, 1);
    if (listOut != NULL)
        *listOut = list;
    else
        xmlFreeNodeList(list);

    xmlFreeInputStream(input);
    return(ctxt->errNo);
}